

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastGdS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  uint32_t uVar2;
  bool bVar3;
  uint uVar4;
  TcParseTableBase *pTVar5;
  MessageLite *pMVar6;
  ulong uVar7;
  string *psVar8;
  char *pcVar9;
  ushort *puVar10;
  int iVar11;
  ushort *puVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  Arena *arena;
  uint *puVar15;
  undefined8 uVar16;
  int iVar17;
  long *plVar18;
  ushort *local_58 [2];
  long local_48;
  long local_40;
  long local_38;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar9 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar9;
  }
  bVar1 = *ptr;
  if ((ulong)table->has_bits_offset != 0) {
    puVar15 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar15 & 3) != 0) {
      AlignFail();
    }
    *puVar15 = *puVar15 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  plVar18 = (long *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)plVar18 & 7) != 0) {
    AlignFail(plVar18);
  }
  pTVar5 = MessageLite::GetTcParseTable
                     (*(MessageLite **)
                       ((long)&table->has_bits_offset +
                       ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset));
  pMVar6 = (MessageLite *)*plVar18;
  if (pMVar6 == (MessageLite *)0x0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar6 = ClassData::New(pTVar5->class_data,arena);
    *plVar18 = (long)pMVar6;
  }
  iVar17 = ctx->depth_;
  local_48 = (long)iVar17 + -1;
  ctx->depth_ = (int)local_48;
  if ((long)iVar17 < 1) {
    puVar12 = (ushort *)0x0;
  }
  else {
    local_58[0] = (ushort *)(ptr + 1);
    local_38 = (long)ctx->group_depth_;
    local_40 = local_38 + 1;
    ctx->group_depth_ = (int)local_40;
    while (bVar3 = EpsCopyInputStream::DoneWithCheck
                             (&ctx->super_EpsCopyInputStream,(char **)local_58,ctx->group_depth_),
          !bVar3) {
      uVar4 = (uint)pTVar5->fast_idx_mask & (uint)*local_58[0];
      if ((uVar4 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x44d);
      }
      uVar7 = (ulong)(uVar4 & 0xfffffff8);
      local_58[0] = (ushort *)
                    (**(code **)(&pTVar5[1].has_bits_offset + uVar7))
                              (pMVar6,local_58[0],ctx,
                               (ulong)*local_58[0] ^
                               *(ulong *)(&pTVar5[1].fast_idx_mask + uVar7 * 2),pTVar5,0);
      if ((local_58[0] == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)
         ) break;
    }
    puVar10 = local_58[0];
    if ((pTVar5->field_0x9 & 1) != 0) {
      puVar10 = (ushort *)(*pTVar5->post_loop_handler)(pMVar6,(char *)local_58[0],ctx);
    }
    if (puVar10 == (ushort *)0x0) {
      iVar11 = ctx->group_depth_ + -1;
      iVar17 = ctx->depth_ + 1;
    }
    else {
      if ((int)local_48 != ctx->depth_) {
        psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (local_48,(long)ctx->depth_,"old_depth == depth_");
        uVar16 = *(undefined8 *)psVar8;
        uVar13 = *(undefined8 *)(psVar8 + 8);
        uVar14 = 0x45b;
LAB_0014c3a5:
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_58,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,uVar14,uVar13,uVar16);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_58);
      }
      iVar11 = (int)local_38;
      if ((int)local_40 != ctx->group_depth_) {
        psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (local_40,(long)ctx->group_depth_,"old_group_depth == group_depth_");
        uVar16 = *(undefined8 *)psVar8;
        uVar13 = *(undefined8 *)(psVar8 + 8);
        uVar14 = 0x45c;
        goto LAB_0014c3a5;
      }
    }
    ctx->group_depth_ = iVar11;
    ctx->depth_ = iVar17;
    uVar2 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    puVar12 = (ushort *)0x0;
    if (uVar2 == bVar1) {
      puVar12 = puVar10;
    }
  }
  return (char *)puVar12;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGdS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint8_t, true, false>(
      PROTOBUF_TC_PARAM_PASS);
}